

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O1

void aiMaterial::CopyPropertyList(aiMaterial *pcDest,aiMaterial *pcSrc)

{
  uint uVar1;
  aiMaterialProperty **ppaVar2;
  aiMaterialProperty *paVar3;
  uint i;
  int iVar4;
  aiMaterialProperty **ppaVar5;
  ulong uVar6;
  aiMaterialProperty *paVar7;
  char *__dest;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  ulong local_48;
  
  if (pcDest == (aiMaterial *)0x0) {
    __assert_fail("__null != pcDest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                  ,0x248,
                  "static void aiMaterial::CopyPropertyList(aiMaterial *, const aiMaterial *)");
  }
  if (pcSrc == (aiMaterial *)0x0) {
    __assert_fail("__null != pcSrc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/Material/MaterialSystem.cpp"
                  ,0x249,
                  "static void aiMaterial::CopyPropertyList(aiMaterial *, const aiMaterial *)");
  }
  uVar1 = pcDest->mNumProperties;
  uVar10 = (ulong)uVar1;
  uVar9 = pcDest->mNumAllocated + pcSrc->mNumAllocated;
  pcDest->mNumAllocated = uVar9;
  pcDest->mNumProperties = pcSrc->mNumProperties + uVar1;
  ppaVar2 = pcDest->mProperties;
  ppaVar5 = (aiMaterialProperty **)operator_new__((ulong)uVar9 << 3);
  pcDest->mProperties = ppaVar5;
  if (ppaVar2 != (aiMaterialProperty **)0x0 && uVar10 != 0) {
    uVar6 = 0;
    do {
      pcDest->mProperties[uVar6] = ppaVar2[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar10 != uVar6);
  }
  if (ppaVar2 != (aiMaterialProperty **)0x0) {
    operator_delete__(ppaVar2);
  }
  local_48 = uVar10;
  if (uVar1 < pcDest->mNumProperties) {
    do {
      paVar3 = pcSrc->mProperties[local_48];
      if (uVar1 != 0) {
        iVar8 = 0;
        uVar6 = 0;
        do {
          paVar7 = pcDest->mProperties[uVar6];
          if ((((paVar7 != (aiMaterialProperty *)0x0) &&
               (uVar9 = (paVar7->mKey).length, uVar9 == (paVar3->mKey).length)) &&
              (iVar4 = bcmp((paVar7->mKey).data,(paVar3->mKey).data,(ulong)uVar9), iVar4 == 0)) &&
             ((paVar7->mSemantic == paVar3->mSemantic && (paVar7->mIndex == paVar3->mIndex)))) {
            if (paVar7->mData != (char *)0x0) {
              operator_delete__(paVar7->mData);
            }
            paVar7->mData = (char *)0x0;
            operator_delete(paVar7);
            memmove(pcDest->mProperties + uVar6,pcDest->mProperties + uVar6 + 1,
                    (ulong)(uint)((int)local_48 + iVar8));
            local_48 = (ulong)((int)local_48 - 1);
            pcDest->mNumProperties = pcDest->mNumProperties - 1;
          }
          uVar6 = uVar6 + 1;
          iVar8 = iVar8 + -1;
        } while (uVar10 != uVar6);
      }
      paVar7 = (aiMaterialProperty *)operator_new(0x420);
      (paVar7->mKey).length = 0;
      (paVar7->mKey).data[0] = '\0';
      memset((paVar7->mKey).data + 1,0x1b,0x3ff);
      paVar7->mSemantic = 0;
      paVar7->mIndex = 0;
      paVar7->mDataLength = 0;
      paVar7->mType = aiPTI_Float;
      paVar7->mData = (char *)0x0;
      pcDest->mProperties[local_48] = paVar7;
      if (paVar7 != paVar3) {
        uVar9 = (paVar3->mKey).length;
        (paVar7->mKey).length = uVar9;
        memcpy((paVar7->mKey).data,(paVar3->mKey).data,(ulong)uVar9);
        (paVar7->mKey).data[uVar9] = '\0';
      }
      uVar9 = paVar3->mDataLength;
      paVar7->mDataLength = uVar9;
      paVar7->mType = paVar3->mType;
      paVar7->mSemantic = paVar3->mSemantic;
      paVar7->mIndex = paVar3->mIndex;
      __dest = (char *)operator_new__((ulong)paVar3->mDataLength);
      paVar7->mData = __dest;
      memcpy(__dest,paVar3->mData,(ulong)uVar9);
      uVar9 = (int)local_48 + 1;
      local_48 = (ulong)uVar9;
    } while (uVar9 < pcDest->mNumProperties);
  }
  return;
}

Assistant:

void aiMaterial::CopyPropertyList(aiMaterial* pcDest,
    const aiMaterial* pcSrc
    )
{
    ai_assert(NULL != pcDest);
    ai_assert(NULL != pcSrc);

    unsigned int iOldNum = pcDest->mNumProperties;
    pcDest->mNumAllocated += pcSrc->mNumAllocated;
    pcDest->mNumProperties += pcSrc->mNumProperties;

    aiMaterialProperty** pcOld = pcDest->mProperties;
    pcDest->mProperties = new aiMaterialProperty*[pcDest->mNumAllocated];

    if (iOldNum && pcOld)   {
        for (unsigned int i = 0; i < iOldNum;++i) {
            pcDest->mProperties[i] = pcOld[i];
        }
    }

    if ( pcOld ) {
        delete[] pcOld;
    }

    for (unsigned int i = iOldNum; i< pcDest->mNumProperties;++i)   {
        aiMaterialProperty* propSrc = pcSrc->mProperties[i];

        // search whether we have already a property with this name -> if yes, overwrite it
        aiMaterialProperty* prop;
        for ( unsigned int q = 0; q < iOldNum; ++q ) {
            prop = pcDest->mProperties[q];
            if (prop /* just for safety */ && prop->mKey == propSrc->mKey && prop->mSemantic == propSrc->mSemantic
                && prop->mIndex == propSrc->mIndex) {
                delete prop;

                // collapse the whole array ...
                memmove(&pcDest->mProperties[q],&pcDest->mProperties[q+1],i-q);
                i--;
                pcDest->mNumProperties--;
            }
        }

        // Allocate the output property and copy the source property
        prop = pcDest->mProperties[i] = new aiMaterialProperty();
        prop->mKey = propSrc->mKey;
        prop->mDataLength = propSrc->mDataLength;
        prop->mType = propSrc->mType;
        prop->mSemantic = propSrc->mSemantic;
        prop->mIndex = propSrc->mIndex;

        prop->mData = new char[propSrc->mDataLength];
        memcpy(prop->mData,propSrc->mData,prop->mDataLength);
    }
}